

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

void __thiscall QTextEdit::mouseReleaseEvent(QTextEdit *this,QMouseEvent *e)

{
  bool bVar1;
  int iVar2;
  QTextEditPrivate *this_00;
  QEvent *in_RSI;
  QTextEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QTextEditPrivate *d;
  undefined1 in_stack_ffffffffffffff9b;
  MouseButton in_stack_ffffffffffffff9c;
  QTextEdit *in_stack_ffffffffffffffa0;
  byte local_51;
  QTextEditPrivate *pQVar3;
  QPoint local_20;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  this_00 = d_func((QTextEdit *)0x6d3f0f);
  QTextEditPrivate::sendControlEvent(pQVar3,in_RSI);
  iVar2 = QMouseEvent::source();
  if ((iVar2 == 0) && (bVar1 = QBasicTimer::isActive(&this_00->autoScrollTimer), bVar1)) {
    QBasicTimer::stop();
    ensureCursorVisible(in_stack_ffffffffffffffa0);
  }
  bVar1 = isReadOnly(in_stack_ffffffffffffffa0);
  local_51 = 0;
  if (!bVar1) {
    local_18 = QWidget::rect((QWidget *)this_00);
    QSinglePointEvent::position((QSinglePointEvent *)0x6d3f99);
    local_20 = QPointF::toPoint((QPointF *)in_RDI);
    local_51 = QRect::contains((QPoint *)&local_18,SUB81(&local_20,0));
  }
  if ((local_51 & 1) != 0) {
    pQVar3 = this_00;
    QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    QWidgetPrivate::handleSoftwareInputPanel
              ((QWidgetPrivate *)this_00,in_stack_ffffffffffffff9c,(bool)in_stack_ffffffffffffff9b);
    this_00 = pQVar3;
  }
  this_00->field_0x320 = this_00->field_0x320 & 0xef;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextEdit::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QTextEdit);
    d->sendControlEvent(e);
    if (e->source() == Qt::MouseEventNotSynthesized && d->autoScrollTimer.isActive()) {
        d->autoScrollTimer.stop();
        ensureCursorVisible();
    }
    if (!isReadOnly() && rect().contains(e->position().toPoint()))
        d->handleSoftwareInputPanel(e->button(), d->clickCausedFocus);
    d->clickCausedFocus = 0;
}